

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

MessageSizeCounts __thiscall capnp::_::ListReader::totalSize(ListReader *this)

{
  long lVar1;
  ElementSize EVar2;
  uint uVar3;
  StructPointerCount SVar4;
  WirePointer *ref;
  Iterator __begin4;
  uint uVar5;
  long lVar6;
  int iVar7;
  WordCount64 amount;
  MessageSizeCounts MVar8;
  
  EVar2 = this->elementSize;
  iVar7 = 0;
  if (EVar2 - 1 < 5) {
    amount = (ulong)*(uint *)(BITS_PER_ELEMENT_TABLE + (ulong)EVar2 * 4) * (ulong)this->elementCount
             + 0x3f >> 6;
    iVar7 = 0;
  }
  else {
    if (EVar2 == POINTER) {
      amount = (WordCount64)this->elementCount;
      if (amount != 0) {
        lVar1 = amount * 8;
        lVar6 = 0;
        iVar7 = 0;
        do {
          MVar8 = WireHelpers::totalSize
                            (this->segment,(WirePointer *)(this->ptr + lVar6),this->nestingLimit);
          amount = amount + MVar8.wordCount;
          iVar7 = iVar7 + MVar8.capCount;
          lVar6 = lVar6 + 8;
        } while (lVar1 - lVar6 != 0);
        goto LAB_0035c621;
      }
    }
    else if (EVar2 == INLINE_COMPOSITE) {
      uVar3 = this->elementCount;
      amount = ((ulong)this->step * (ulong)uVar3 >> 6) + 1;
      if (uVar3 != 0 && this->structPointerCount != 0) {
        ref = (WirePointer *)this->ptr;
        iVar7 = 0;
        uVar5 = 0;
        do {
          ref = ref + (this->structDataSize >> 6);
          for (SVar4 = this->structPointerCount; SVar4 != 0; SVar4 = SVar4 - 1) {
            MVar8 = WireHelpers::totalSize(this->segment,ref,this->nestingLimit);
            amount = amount + MVar8.wordCount;
            iVar7 = iVar7 + MVar8.capCount;
            ref = ref + 1;
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != uVar3);
      }
      goto LAB_0035c621;
    }
    iVar7 = 0;
    amount = 0;
  }
LAB_0035c621:
  if (this->segment != (SegmentReader *)0x0) {
    ReadLimiter::unread(this->segment->readLimiter,amount);
  }
  MVar8.capCount = iVar7;
  MVar8.wordCount = amount;
  MVar8._12_4_ = 0;
  return MVar8;
}

Assistant:

MessageSizeCounts ListReader::totalSize() const {
  // TODO(cleanup): This is kind of a lot of logic duplicated from WireHelpers::totalSize(), but
  //   it's unclear how to share it effectively.

  MessageSizeCounts result = { ZERO * WORDS, 0 };

  switch (elementSize) {
    case ElementSize::VOID:
      // Nothing.
      break;
    case ElementSize::BIT:
    case ElementSize::BYTE:
    case ElementSize::TWO_BYTES:
    case ElementSize::FOUR_BYTES:
    case ElementSize::EIGHT_BYTES:
      result.addWords(WireHelpers::roundBitsUpToWords(
          upgradeBound<uint64_t>(elementCount) * dataBitsPerElement(elementSize)));
      break;
    case ElementSize::POINTER: {
      auto count = elementCount * (POINTERS / ELEMENTS);
      result.addWords(count * WORDS_PER_POINTER);

      for (auto i: kj::zeroTo(count)) {
        result += WireHelpers::totalSize(segment, reinterpret_cast<const WirePointer*>(ptr) + i,
                                         nestingLimit);
      }
      break;
    }
    case ElementSize::INLINE_COMPOSITE: {
      // Don't forget to count the tag word.
      auto wordSize = upgradeBound<uint64_t>(elementCount) * step / BITS_PER_WORD;
      result.addWords(wordSize + POINTER_SIZE_IN_WORDS);

      if (structPointerCount > ZERO * POINTERS) {
        const word* pos = reinterpret_cast<const word*>(ptr);
        for (auto i KJ_UNUSED: kj::zeroTo(elementCount)) {
          pos += structDataSize / BITS_PER_WORD;

          for (auto j KJ_UNUSED: kj::zeroTo(structPointerCount)) {
            result += WireHelpers::totalSize(segment, reinterpret_cast<const WirePointer*>(pos),
                                             nestingLimit);
            pos += POINTER_SIZE_IN_WORDS;
          }
        }
      }
      break;
    }
  }

  if (segment != nullptr) {
    // This traversal should not count against the read limit, because it's highly likely that
    // the caller is going to traverse the object again, e.g. to copy it.
    segment->unread(result.wordCount);
  }

  return result;
}